

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

string * __thiscall UniformData::print_abi_cxx11_(string *__return_storage_ptr__,UniformData *this)

{
  reference _value;
  string local_58;
  ulong local_38;
  size_t i;
  allocator local_1a;
  undefined1 local_19;
  UniformData *local_18;
  UniformData *this_local;
  string *rta;
  
  local_19 = 0;
  local_18 = this;
  this_local = (UniformData *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  for (local_38 = 0; local_38 < this->size; local_38 = local_38 + 1) {
    _value = std::array<float,_4UL>::operator[](&this->value,local_38);
    vera::toString<float>(&local_58,_value);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (local_38 < this->size - 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UniformData::print() {
    std::string rta = "";
    for (size_t i = 0; i < size; i++) {
        rta += vera::toString(value[i]);
        if (i < size - 1)
            rta += ",";
    }
    return rta;
}